

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EndpointInfo.cpp
# Opt level: O1

void __thiscall
helics::EndpointInfo::disconnectFederate(EndpointInfo *this,GlobalFederateId fedToDisconnect)

{
  pointer pEVar1;
  iterator __last;
  pointer ppVar2;
  pointer pEVar3;
  long lVar4;
  pointer pEVar5;
  EndpointInformation *targetInfo;
  iterator iVar6;
  
  pEVar5 = (this->targetInformation).
           super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pEVar1 = (this->targetInformation).
           super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pEVar5 != pEVar1) {
    lVar4 = ((long)pEVar1 - (long)pEVar5 >> 3) * -0x71c71c71c71c71c7 >> 2;
    pEVar3 = pEVar5;
    if (0 < lVar4) {
      pEVar3 = pEVar5 + lVar4 * 4;
      lVar4 = lVar4 + 1;
      iVar6._M_current = pEVar5 + 2;
      do {
        if (iVar6._M_current[-2].id.fed_id.gid == fedToDisconnect.gid) {
          iVar6._M_current = iVar6._M_current + -2;
          goto LAB_00330239;
        }
        if (iVar6._M_current[-1].id.fed_id.gid == fedToDisconnect.gid) {
          iVar6._M_current = iVar6._M_current + -1;
          goto LAB_00330239;
        }
        if (((iVar6._M_current)->id).fed_id.gid == fedToDisconnect.gid) goto LAB_00330239;
        if (iVar6._M_current[1].id.fed_id.gid == fedToDisconnect.gid) {
          iVar6._M_current = iVar6._M_current + 1;
          goto LAB_00330239;
        }
        lVar4 = lVar4 + -1;
        iVar6._M_current = iVar6._M_current + 4;
      } while (1 < lVar4);
    }
    lVar4 = ((long)pEVar1 - (long)pEVar3 >> 3) * -0x71c71c71c71c71c7;
    if (lVar4 == 1) {
LAB_0033021b:
      iVar6._M_current = pEVar3;
      if ((pEVar3->id).fed_id.gid != fedToDisconnect.gid) {
        iVar6._M_current = pEVar1;
      }
    }
    else if (lVar4 == 2) {
LAB_00330213:
      iVar6._M_current = pEVar3;
      if ((pEVar3->id).fed_id.gid != fedToDisconnect.gid) {
        pEVar3 = pEVar3 + 1;
        goto LAB_0033021b;
      }
    }
    else {
      iVar6._M_current = pEVar1;
      if ((lVar4 == 3) &&
         (iVar6._M_current = pEVar3, (pEVar3->id).fed_id.gid != fedToDisconnect.gid)) {
        pEVar3 = pEVar3 + 1;
        goto LAB_00330213;
      }
    }
LAB_00330239:
    pEVar5 = iVar6._M_current + 1;
    if (pEVar5 != pEVar1 && iVar6._M_current != pEVar1) {
      do {
        if ((pEVar5->id).fed_id.gid != fedToDisconnect.gid) {
          (iVar6._M_current)->id = pEVar5->id;
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &(iVar6._M_current)->key,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &pEVar5->key);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &(iVar6._M_current)->type,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &pEVar5->type);
          iVar6._M_current = iVar6._M_current + 1;
        }
        pEVar5 = pEVar5 + 1;
      } while (pEVar5 != pEVar1);
    }
    __last._M_current =
         (this->targetInformation).
         super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar6._M_current != __last._M_current) {
      std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>::
      _M_erase(&this->targetInformation,iVar6,__last);
      ppVar2 = (this->targets).
               super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((this->targets).
          super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != ppVar2) {
        (this->targets).
        super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppVar2;
      }
      pEVar5 = (this->targetInformation).
               super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pEVar1 = (this->targetInformation).
               super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pEVar5 != pEVar1) {
        do {
          std::
          vector<std::pair<helics::GlobalHandle,std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<helics::GlobalHandle,std::basic_string_view<char,std::char_traits<char>>>>>
          ::emplace_back<helics::GlobalHandle_const&,std::__cxx11::string_const&>
                    ((vector<std::pair<helics::GlobalHandle,std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<helics::GlobalHandle,std::basic_string_view<char,std::char_traits<char>>>>>
                      *)&this->targets,&pEVar5->id,&pEVar5->key);
          pEVar5 = pEVar5 + 1;
        } while (pEVar5 != pEVar1);
      }
    }
  }
  pEVar5 = (this->sourceInformation).
           super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pEVar1 = (this->sourceInformation).
           super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pEVar5 == pEVar1) {
    return;
  }
  lVar4 = ((long)pEVar1 - (long)pEVar5 >> 3) * -0x71c71c71c71c71c7 >> 2;
  pEVar3 = pEVar5;
  if (0 < lVar4) {
    pEVar3 = pEVar5 + lVar4 * 4;
    lVar4 = lVar4 + 1;
    iVar6._M_current = pEVar5 + 2;
    do {
      if (iVar6._M_current[-2].id.fed_id.gid == fedToDisconnect.gid) {
        iVar6._M_current = iVar6._M_current + -2;
        goto LAB_003303d2;
      }
      if (iVar6._M_current[-1].id.fed_id.gid == fedToDisconnect.gid) {
        iVar6._M_current = iVar6._M_current + -1;
        goto LAB_003303d2;
      }
      if (((iVar6._M_current)->id).fed_id.gid == fedToDisconnect.gid) goto LAB_003303d2;
      if (iVar6._M_current[1].id.fed_id.gid == fedToDisconnect.gid) {
        iVar6._M_current = iVar6._M_current + 1;
        goto LAB_003303d2;
      }
      lVar4 = lVar4 + -1;
      iVar6._M_current = iVar6._M_current + 4;
    } while (1 < lVar4);
  }
  lVar4 = ((long)pEVar1 - (long)pEVar3 >> 3) * -0x71c71c71c71c71c7;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      iVar6._M_current = pEVar1;
      if ((lVar4 != 3) ||
         (iVar6._M_current = pEVar3, (pEVar3->id).fed_id.gid == fedToDisconnect.gid))
      goto LAB_003303d2;
      pEVar3 = pEVar3 + 1;
    }
    iVar6._M_current = pEVar3;
    if ((pEVar3->id).fed_id.gid == fedToDisconnect.gid) goto LAB_003303d2;
    pEVar3 = pEVar3 + 1;
  }
  iVar6._M_current = pEVar3;
  if ((pEVar3->id).fed_id.gid != fedToDisconnect.gid) {
    iVar6._M_current = pEVar1;
  }
LAB_003303d2:
  pEVar5 = iVar6._M_current + 1;
  if (pEVar5 != pEVar1 && iVar6._M_current != pEVar1) {
    do {
      if ((pEVar5->id).fed_id.gid != fedToDisconnect.gid) {
        (iVar6._M_current)->id = pEVar5->id;
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &(iVar6._M_current)->key,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pEVar5->key)
        ;
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &(iVar6._M_current)->type,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pEVar5->type
                 );
        iVar6._M_current = iVar6._M_current + 1;
      }
      pEVar5 = pEVar5 + 1;
    } while (pEVar5 != pEVar1);
  }
  std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>::_M_erase
            (&this->sourceInformation,iVar6,
             (this->sourceInformation).
             super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  return;
}

Assistant:

void EndpointInfo::disconnectFederate(GlobalFederateId fedToDisconnect)
{
    if (!targetInformation.empty()) {
        auto removeIterator = std::remove_if(targetInformation.begin(),
                                             targetInformation.end(),
                                             [fedToDisconnect](const auto& targetInfo) {
                                                 return targetInfo.id.fed_id == fedToDisconnect;
                                             });
        if (removeIterator != targetInformation.end()) {
            targetInformation.erase(removeIterator, targetInformation.end());
            targets.clear();
            for (const auto& targetInfo : targetInformation) {
                targets.emplace_back(targetInfo.id, targetInfo.key);
            }
        }
    }
    if (!sourceInformation.empty()) {
        auto removeIterator = std::remove_if(sourceInformation.begin(),
                                             sourceInformation.end(),
                                             [fedToDisconnect](const auto& sinfo) {
                                                 return sinfo.id.fed_id == fedToDisconnect;
                                             });
        sourceInformation.erase(removeIterator, sourceInformation.end());
    }
}